

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::GenerateBlockSyntax::setChild
          (GenerateBlockSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00ae8d9c + *(int *)(&DAT_00ae8d9c + in_RSI * 4)))();
  return;
}

Assistant:

void GenerateBlockSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 2: begin = child.token(); return;
        case 3: beginName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        case 4: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 5: end = child.token(); return;
        case 6: endName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}